

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  lua_State *plVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue TVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TValue TVar8;
  TValue TVar9;
  TValue TVar10;
  TValue TVar11;
  int iVar12;
  TValue *pTVar13;
  ulong uVar14;
  RecCatDataCP rcd;
  uint32_t local_58;
  uint32_t uStack_54;
  uint32_t uStack_50;
  undefined4 uStack_4c;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  TValue local_38;
  jit_State *local_30;
  BCReg local_28;
  BCReg local_24;
  TRef local_20;
  
  plVar1 = J->L;
  pTVar2 = plVar1->base;
  pTVar3 = plVar1->top;
  uVar14 = (ulong)(topslot - 1);
  pTVar13 = pTVar2 + uVar14;
  local_58 = (pTVar13->u32).lo;
  uStack_54 = (pTVar13->field_2).it;
  uStack_50 = pTVar13[1].u32.lo;
  uStack_4c = *(undefined4 *)((long)pTVar13 + 0xc);
  pTVar13 = pTVar2 + uVar14 + 2;
  local_48 = (pTVar13->u32).lo;
  uStack_44 = (pTVar13->field_2).it;
  uStack_40 = pTVar13[1].u32.lo;
  uStack_3c = *(undefined4 *)((long)pTVar13 + 0xc);
  local_38 = pTVar2[uVar14 + 4];
  local_30 = J;
  local_28 = baseslot;
  local_24 = topslot;
  iVar12 = lj_vm_cpcall(plVar1,0,&local_58,rec_mm_concat_cp);
  if (iVar12 == 0) {
    pTVar13 = plVar1->base;
    uVar14 = (ulong)(local_24 - 1);
    pTVar13[uVar14 + 4] = local_38;
    TVar4.field_2.it = uStack_54;
    TVar4.u32.lo = local_58;
    TVar7.field_2.it = uStack_4c;
    TVar7.u32.lo = uStack_50;
    TVar9.field_2.it = uStack_44;
    TVar9.u32.lo = local_48;
    TVar11.field_2.it = uStack_3c;
    TVar11.u32.lo = uStack_40;
    pTVar13[uVar14 + 2] = TVar9;
    (pTVar13 + uVar14 + 2)[1] = TVar11;
    pTVar13[uVar14] = TVar4;
    (pTVar13 + uVar14)[1] = TVar7;
  }
  else {
    pTVar13 = plVar1->base;
    TVar4 = plVar1->top[-1];
    uVar14 = (ulong)(local_24 - 1);
    pTVar13[uVar14 + 4] = local_38;
    TVar5.field_2.it = uStack_54;
    TVar5.u32.lo = local_58;
    TVar6.field_2.it = uStack_4c;
    TVar6.u32.lo = uStack_50;
    TVar8.field_2.it = uStack_44;
    TVar8.u32.lo = local_48;
    TVar10.field_2.it = uStack_3c;
    TVar10.u32.lo = uStack_40;
    pTVar13[uVar14 + 2] = TVar8;
    (pTVar13 + uVar14 + 2)[1] = TVar10;
    pTVar13[uVar14] = TVar5;
    (pTVar13 + uVar14)[1] = TVar6;
    pTVar13 = (TValue *)((long)plVar1->base + ((long)pTVar3 - (long)pTVar2));
    plVar1->top = pTVar13 + 1;
    *pTVar13 = TVar4;
    local_20 = -iVar12;
  }
  return local_20;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  lua_State *L = J->L;
  ptrdiff_t delta = L->top - L->base;
  TValue errobj;
  RecCatDataCP rcd;
  int errcode;
  rcd.J = J;
  rcd.baseslot = baseslot;
  rcd.topslot = topslot;
  /* Save slots. */
  memcpy(rcd.savetv, &L->base[topslot-1], sizeof(rcd.savetv));
  errcode = lj_vm_cpcall(L, NULL, &rcd, rec_mm_concat_cp);
  if (errcode) copyTV(L, &errobj, L->top-1);
  /* Restore slots. */
  memcpy(&L->base[rcd.topslot-1], rcd.savetv, sizeof(rcd.savetv));
  if (errcode) {
    L->top = L->base + delta;
    copyTV(L, L->top++, &errobj);
    return (TRef)(-errcode);
  }
  return rcd.tr;
}